

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_cbs_auth.c
# Opt level: O1

OPTIONHANDLER_HANDLE authentication_retrieve_options(AUTHENTICATION_HANDLE authentication_handle)

{
  OPTIONHANDLER_RESULT OVar1;
  OPTIONHANDLER_HANDLE handle;
  LOGGER_LOG p_Var2;
  int iVar3;
  OPTIONHANDLER_HANDLE pOVar4;
  char *pcVar5;
  
  if (authentication_handle == (AUTHENTICATION_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return (OPTIONHANDLER_HANDLE)0x0;
    }
    pcVar5 = 
    "Failed to retrieve options from authentication instance (authentication_handle is NULL)";
    iVar3 = 0x294;
  }
  else {
    handle = OptionHandler_Create
                       (authentication_clone_option,authentication_destroy_option,
                        authentication_set_option);
    if (handle != (OPTIONHANDLER_HANDLE)0x0) {
      OVar1 = OptionHandler_AddOption
                        (handle,"cbs_request_timeout_secs",
                         &authentication_handle->cbs_request_timeout_secs);
      pOVar4 = handle;
      if (OVar1 != OPTIONHANDLER_OK) {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 == (LOGGER_LOG)0x0) {
          pOVar4 = (OPTIONHANDLER_HANDLE)0x0;
        }
        else {
          pOVar4 = (OPTIONHANDLER_HANDLE)0x0;
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_cbs_auth.c"
                    ,"authentication_retrieve_options",0x2a6,1,
                    "Failed to retrieve options from authentication instance (OptionHandler_Create failed for option \'%s\')"
                    ,"cbs_request_timeout_secs");
        }
      }
      if (pOVar4 == (OPTIONHANDLER_HANDLE)0x0) {
        OptionHandler_Destroy(handle);
        return (OPTIONHANDLER_HANDLE)0x0;
      }
      return pOVar4;
    }
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return (OPTIONHANDLER_HANDLE)0x0;
    }
    pcVar5 = "Failed to retrieve options from authentication instance (OptionHandler_Create failed)"
    ;
    iVar3 = 0x29d;
  }
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_cbs_auth.c"
            ,"authentication_retrieve_options",iVar3,1,pcVar5);
  return (OPTIONHANDLER_HANDLE)0x0;
}

Assistant:

OPTIONHANDLER_HANDLE authentication_retrieve_options(AUTHENTICATION_HANDLE authentication_handle)
{
    OPTIONHANDLER_HANDLE result;

    if (authentication_handle == NULL)
    {
        LogError("Failed to retrieve options from authentication instance (authentication_handle is NULL)");
        result = NULL;
    }
    else
    {
        OPTIONHANDLER_HANDLE options = OptionHandler_Create(authentication_clone_option, authentication_destroy_option, (pfSetOption)authentication_set_option);

        if (options == NULL)
        {
            LogError("Failed to retrieve options from authentication instance (OptionHandler_Create failed)");
            result = NULL;
        }
        else
        {
            AUTHENTICATION_INSTANCE* instance = (AUTHENTICATION_INSTANCE*)authentication_handle;

            if (OptionHandler_AddOption(options, AUTHENTICATION_OPTION_CBS_REQUEST_TIMEOUT_SECS, (void*)&instance->cbs_request_timeout_secs) != OPTIONHANDLER_OK)
            {
                LogError("Failed to retrieve options from authentication instance (OptionHandler_Create failed for option '%s')", AUTHENTICATION_OPTION_CBS_REQUEST_TIMEOUT_SECS);
                result = NULL;
            }
            else
            {
                result = options;
            }

            if (result == NULL)
            {
                OptionHandler_Destroy(options);
            }
        }
    }
    return result;
}